

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setOptions(QFileDialog *this,Options options)

{
  bool bVar1;
  QFlagsStorage<QFileDialog::Option> QVar2;
  Int IVar3;
  QFlagsStorage<QDir::Filter> filters;
  QFileDialogPrivate *this_00;
  QFileDialogOptions *this_01;
  QAbstractFileIconProvider *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool ro;
  QFileDialogPrivate *d;
  Options providerOptions;
  Options changed;
  QFileDialogPrivate *in_stack_00000430;
  undefined4 in_stack_ffffffffffffff58;
  Option in_stack_ffffffffffffff5c;
  QFileDialogPrivate *in_stack_ffffffffffffff60;
  QFileDialog *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff7b;
  Option in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_60;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_5c;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_40;
  undefined4 local_3c;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_38;
  undefined4 local_34;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_30;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_2c;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_28;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_24;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_20;
  QFlagsStorageHelper<QFileDialog::Option,_4> local_1c;
  QFlag local_18 [2];
  QFlagsStorage<QFileDialog::Option> local_10;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDialog *)0x74d537);
  local_10.i = 0xaaaaaaaa;
  QVar2.i = (Int)QFileDialog::options(in_stack_ffffffffffffff68);
  local_10.i = (Int)QFlags<QFileDialog::Option>::operator^
                              ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                               (QFlagsStorageHelper<QFileDialog::Option,_4>)
                               SUB84(in_stack_ffffffffffffff68,0));
  bVar1 = QFlags<QFileDialog::Option>::operator!((QFlags<QFileDialog::Option> *)&local_10);
  if (!bVar1) {
    this_01 = QSharedPointer<QFileDialogOptions>::operator->
                        ((QSharedPointer<QFileDialogOptions> *)0x74d598);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int(local_c);
    QFlag::QFlag(local_18,IVar3);
    QFlags<QFileDialogOptions::FileDialogOption>::QFlagsStorageHelper
              ((QFlags<QFileDialogOptions::FileDialogOption> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (QFlag)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    QFileDialogOptions::setOptions((QFlags_conflict1 *)this_01);
    local_1c.super_QFlagsStorage<QFileDialog::Option>.i =
         (QFlagsStorage<QFileDialog::Option>)
         QFlags<QFileDialog::Option>::operator&
                   ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    if (IVar3 != 0) {
      (this_00->super_QDialogPrivate).nativeDialogInUse = false;
      QFileDialogPrivate::createWidgets(in_stack_00000430);
    }
    bVar1 = QFileDialogPrivate::usingWidgets(in_stack_ffffffffffffff60);
    if (bVar1) {
      local_20.super_QFlagsStorage<QFileDialog::Option>.i =
           (QFlagsStorage<QFileDialog::Option>)
           QFlags<QFileDialog::Option>::operator&
                     ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
      if (IVar3 != 0) {
        in_stack_ffffffffffffff60 = (QFileDialogPrivate *)this_00->model;
        local_24.super_QFlagsStorage<QFileDialog::Option>.i =
             (QFlagsStorage<QFileDialog::Option>)
             QFlags<QFileDialog::Option>::operator&
                       ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
        QFlags<QFileDialog::Option>::operator!((QFlags<QFileDialog::Option> *)&local_24);
        QFileSystemModel::setResolveSymlinks(SUB81(in_stack_ffffffffffffff60,0));
      }
      local_28.super_QFlagsStorage<QFileDialog::Option>.i =
           (QFlagsStorage<QFileDialog::Option>)
           QFlags<QFileDialog::Option>::operator&
                     ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
      if (IVar3 != 0) {
        local_2c.super_QFlagsStorage<QFileDialog::Option>.i =
             (QFlagsStorage<QFileDialog::Option>)
             QFlags<QFileDialog::Option>::operator&
                       ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
        in_stack_ffffffffffffff80 = CONCAT13(IVar3 != 0,(int3)in_stack_ffffffffffffff80);
        QFileSystemModel::setReadOnly(SUB81(this_00->model,0));
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  (&this_00->qFileDialogUi);
        QWidget::setEnabled(in_RDI,SUB81((ulong)this_01 >> 0x38,0));
        QAction::setEnabled(SUB81(this_00->renameAction,0));
        QAction::setEnabled(SUB81(this_00->deleteAction,0));
      }
      local_30.super_QFlagsStorage<QFileDialog::Option>.i =
           (QFlagsStorage<QFileDialog::Option>)
           QFlags<QFileDialog::Option>::operator&
                     ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
      if (IVar3 != 0) {
        local_34 = 0xaaaaaaaa;
        pQVar4 = iconProvider((QFileDialog *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_34 = (**(code **)(*(long *)pQVar4 + 0x30))();
        local_38.super_QFlagsStorage<QFileDialog::Option>.i =
             (QFlagsStorage<QFileDialog::Option>)
             QFlags<QFileDialog::Option>::operator&
                       ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
        ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
        QFlags<QAbstractFileIconProvider::Option>::setFlag
                  ((QFlags<QAbstractFileIconProvider::Option> *)
                   CONCAT44(QVar2.i,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c,
                   (bool)in_stack_ffffffffffffff7b);
        pQVar4 = iconProvider((QFileDialog *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_3c = local_34;
        (**(code **)(*(long *)pQVar4 + 0x28))(pQVar4,local_34);
      }
    }
    local_40.super_QFlagsStorage<QFileDialog::Option>.i =
         (QFlagsStorage<QFileDialog::Option>)
         QFlags<QFileDialog::Option>::operator&
                   ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40);
    if (IVar3 != 0) {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x74d851)
      ;
      QFileDialogOptions::nameFilters();
      setNameFilters((QFileDialog *)this_00,
                     (QStringList *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80));
      QList<QString>::~QList((QList<QString> *)0x74d877);
    }
    local_5c.super_QFlagsStorage<QFileDialog::Option>.i =
         (QFlagsStorage<QFileDialog::Option>)
         QFlags<QFileDialog::Option>::operator&
                   ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
    if (IVar3 != 0) {
      local_60.super_QFlagsStorage<QFileDialog::Option>.i =
           (QFlagsStorage<QFileDialog::Option>)
           QFlags<QFileDialog::Option>::operator&
                     ((QFlags<QFileDialog::Option> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_60);
      if (IVar3 == 0) {
        filter((QFileDialog *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        filters.i = (Int)QFlags<QDir::Filter>::operator|
                                   ((QFlags<QDir::Filter> *)in_stack_ffffffffffffff60,
                                    in_stack_ffffffffffffff5c);
      }
      else {
        filter((QFileDialog *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        filters.i = (Int)QFlags<QDir::Filter>::operator&
                                   ((QFlags<QDir::Filter> *)in_stack_ffffffffffffff60,
                                    in_stack_ffffffffffffff5c);
      }
      setFilter((QFileDialog *)this_01,(Filters)filters.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setOptions(Options options)
{
    Q_D(QFileDialog);

    Options changed = (options ^ QFileDialog::options());
    if (!changed)
        return;

    d->options->setOptions(QFileDialogOptions::FileDialogOptions(int(options)));

    if (options & DontUseNativeDialog) {
        d->nativeDialogInUse = false;
        d->createWidgets();
    }

    if (d->usingWidgets()) {
        if (changed & DontResolveSymlinks)
            d->model->setResolveSymlinks(!(options & DontResolveSymlinks));
        if (changed & ReadOnly) {
            bool ro = (options & ReadOnly);
            d->model->setReadOnly(ro);
            d->qFileDialogUi->newFolderButton->setEnabled(!ro);
            d->renameAction->setEnabled(!ro);
            d->deleteAction->setEnabled(!ro);
        }

        if (changed & DontUseCustomDirectoryIcons) {
            QFileIconProvider::Options providerOptions = iconProvider()->options();
            providerOptions.setFlag(QFileIconProvider::DontUseCustomDirectoryIcons,
                                    options & DontUseCustomDirectoryIcons);
            iconProvider()->setOptions(providerOptions);
        }
    }

    if (changed & HideNameFilterDetails)
        setNameFilters(d->options->nameFilters());

    if (changed & ShowDirsOnly)
        setFilter((options & ShowDirsOnly) ? filter() & ~QDir::Files : filter() | QDir::Files);
}